

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day-or-night.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *this;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double rate;
  uint64_t pixels;
  uint64_t total_gray;
  int b;
  int g;
  int r;
  
  g = 0;
  pixels = 0;
  rate = 0.0;
  while( true ) {
    iVar1 = __isoc99_scanf("%d,%d,%d",&total_gray,(long)&total_gray + 4,&b);
    if (iVar1 == -1) break;
    pixels = (long)((b + total_gray._4_4_ + (int)total_gray) / 3) + pixels;
    rate = (double)((long)rate + 1);
  }
  auVar3._8_4_ = (int)(pixels >> 0x20);
  auVar3._0_8_ = pixels;
  auVar3._12_4_ = 0x45300000;
  auVar4._8_4_ = (int)((ulong)rate >> 0x20);
  auVar4._0_8_ = rate;
  auVar4._12_4_ = 0x45300000;
  pcVar2 = "night";
  if (0.3 < (((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)pixels) - 4503599627370496.0)) /
            ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(rate,0)) - 4503599627370496.0))) / 255.0) {
    pcVar2 = "day";
  }
  this = std::operator<<((ostream *)&std::cout,pcVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  int r, g, b;
  uint64_t total_gray = 0,  pixels = 0;
  while (std::scanf("%d,%d,%d", &b, &g, &r) != EOF) {
    total_gray += (r + g + b) / 3;
    pixels += 1;
  }
  const double rate = double(total_gray) / double(pixels) / 255;
  std::cout << (rate > 0.3 ? "day" : "night") << std::endl;
  return 0;
}